

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid)

{
  uint uVar1;
  int local_88;
  byte local_81;
  int local_80;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_node;
  REF_INT node1;
  REF_INT node0;
  REF_GLOB global;
  uint local_30;
  REF_BOOL tri_side;
  REF_BOOL allowed;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node = (REF_NODE)ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&allowed,ref_grid);
  if (uVar1 == 0) {
    for (tri_side = 0; tri_side < _allowed->n; tri_side = tri_side + 1) {
      new_node = _allowed->e2n[tri_side << 1];
      ref_private_macro_code_rss = _allowed->e2n[tri_side * 2 + 1];
      uVar1 = ref_cell_has_side((REF_CELL)ref_node->ref_mpi,new_node,ref_private_macro_code_rss,
                                (REF_BOOL *)&local_30);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x3b5,"ref_split_edge_geometry",(ulong)uVar1,"has side");
        return uVar1;
      }
      if (local_30 != 0) {
        uVar1 = ref_split_edge_mixed
                          ((REF_GRID)ref_node,new_node,ref_private_macro_code_rss,
                           (REF_BOOL *)&local_30);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x3b8,"ref_split_edge_geometry",(ulong)uVar1,"mixed");
          return uVar1;
        }
        if (local_30 != 0) {
          uVar1 = ref_cell_has_side((REF_CELL)ref_node->part,new_node,ref_private_macro_code_rss,
                                    (REF_BOOL *)((long)&global + 4));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x3bc,"ref_split_edge_geometry",(ulong)uVar1,"has side");
            return uVar1;
          }
          if ((new_node < 0) || (**(int **)(ref_node->part + 0x10) <= new_node)) {
            local_80 = -1;
          }
          else {
            local_80 = *(int *)(*(long *)(*(long *)(ref_node->part + 0x10) + 8) + (long)new_node * 4
                               );
          }
          local_81 = 0;
          if (local_80 != -1) {
            if ((ref_private_macro_code_rss < 0) ||
               (**(int **)(ref_node->part + 0x10) <= ref_private_macro_code_rss)) {
              local_88 = -1;
            }
            else {
              local_88 = *(int *)(*(long *)(*(long *)(ref_node->part + 0x10) + 8) +
                                 (long)ref_private_macro_code_rss * 4);
            }
            local_81 = 0;
            if (local_88 != -1) {
              local_81 = global._4_4_ != 0 ^ 0xff;
            }
          }
          local_30 = (uint)(local_81 & 1);
          if (local_30 != 0) {
            uVar1 = ref_cell_local_gem((REF_CELL)ref_node->ref_mpi,(REF_NODE)ref_edge,new_node,
                                       ref_private_macro_code_rss,(REF_BOOL *)&local_30);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x3c4,"ref_split_edge_geometry",(ulong)uVar1,"local tet");
              return uVar1;
            }
            if (local_30 == 0) {
              (&(ref_edge[1].adj)->nnode)[new_node] = (&(ref_edge[1].adj)->nnode)[new_node] + 1;
              (&(ref_edge[1].adj)->nnode)[ref_private_macro_code_rss] =
                   (&(ref_edge[1].adj)->nnode)[ref_private_macro_code_rss] + 1;
            }
            else {
              uVar1 = ref_node_next_global((REF_NODE)ref_edge,(REF_GLOB *)&node1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3cb,"ref_split_edge_geometry",(ulong)uVar1,"next global");
                return uVar1;
              }
              uVar1 = ref_node_add((REF_NODE)ref_edge,_node1,&ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3cc,"ref_split_edge_geometry",(ulong)uVar1,"new node");
                return uVar1;
              }
              uVar1 = ref_node_interpolate_edge
                                ((REF_NODE)ref_edge,new_node,ref_private_macro_code_rss,0.5,
                                 ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3ce,"ref_split_edge_geometry",(ulong)uVar1,"interp new node");
                return uVar1;
              }
              uVar1 = ref_geom_add_between
                                ((REF_GRID)ref_node,new_node,ref_private_macro_code_rss,0.5,
                                 ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3d0,"ref_split_edge_geometry",(ulong)uVar1,"geom new node");
                return uVar1;
              }
              uVar1 = ref_geom_constrain((REF_GRID)ref_node,ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3d1,"ref_split_edge_geometry",(ulong)uVar1,"geom constraint");
                return uVar1;
              }
              uVar1 = ref_metric_interpolate_between
                                ((REF_GRID)ref_node,new_node,ref_private_macro_code_rss,
                                 ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3d3,"ref_split_edge_geometry",(ulong)uVar1,"interp new node metric");
                return uVar1;
              }
              uVar1 = ref_split_edge((REF_GRID)ref_node,new_node,ref_private_macro_code_rss,
                                     ref_private_macro_code_rss_1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x3d5,"ref_split_edge_geometry",(ulong)uVar1,"split");
                return uVar1;
              }
            }
          }
        }
      }
    }
    ref_edge_free(_allowed);
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x3af,
           "ref_split_edge_geometry",(ulong)uVar1,"orig edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed, tri_side;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &tri_side),
        "has side");
    allowed =
        (!ref_cell_node_empty(ref_grid_tri(ref_grid), node0) &&
         !ref_cell_node_empty(ref_grid_tri(ref_grid), node1) && !tri_side);
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}